

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O2

int __thiscall Pyraminx::count_correct_interior(Pyraminx *this)

{
  pointer psVar1;
  int *piVar2;
  int iVar3;
  int i;
  long lVar4;
  long lVar5;
  
  psVar1 = (this->face_list).
           super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar3 = 0;
  for (lVar4 = 0;
      lVar4 != (long)(this->face_list).
                     super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4;
      lVar4 = lVar4 + 1) {
    piVar2 = (int *)psVar1[lVar4].super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 4) {
      iVar3 = iVar3 + (uint)(piVar2[(long)*(int *)((long)&DAT_00109350 + lVar5) + 0x2e] == *piVar2);
    }
  }
  return iVar3;
}

Assistant:

int Pyraminx::count_correct_interior(){
    int count = 0;
    int interior_loc[6] = {2, 5, 7, 10, 12, 14};
    int interior_len = sizeof(interior_loc)/ sizeof(int);
    for(int i = 0; i < face_list.size(); i++){
        Color center_color = face_list[i]->get_center_color();
        for(int j = 0; j< interior_len; j++){
            if(face_list[i]->color_data[interior_loc[j]] == center_color){
                count++;
            }
        }
    }
    //printf("Correct interior pieces: %i/24\n", count);
    return count; 
}